

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

void Vaxpy_Serial(realtype a,N_Vector x,N_Vector y)

{
  int iVar1;
  long lVar2;
  long lVar3;
  realtype *yd;
  realtype *xd;
  sunindextype N;
  sunindextype i;
  N_Vector y_local;
  N_Vector x_local;
  realtype a_local;
  
  iVar1 = *x->content;
  lVar2 = *(long *)((long)x->content + 8);
  lVar3 = *(long *)((long)y->content + 8);
  if ((a != 1.0) || (NAN(a))) {
    if ((a != -1.0) || (NAN(a))) {
      for (i = 0; i < iVar1; i = i + 1) {
        *(double *)(lVar3 + (long)i * 8) =
             a * *(double *)(lVar2 + (long)i * 8) + *(double *)(lVar3 + (long)i * 8);
      }
    }
    else {
      for (i = 0; i < iVar1; i = i + 1) {
        *(double *)(lVar3 + (long)i * 8) =
             *(double *)(lVar3 + (long)i * 8) - *(double *)(lVar2 + (long)i * 8);
      }
    }
  }
  else {
    for (i = 0; i < iVar1; i = i + 1) {
      *(double *)(lVar3 + (long)i * 8) =
           *(double *)(lVar2 + (long)i * 8) + *(double *)(lVar3 + (long)i * 8);
    }
  }
  return;
}

Assistant:

static void Vaxpy_Serial(realtype a, N_Vector x, N_Vector y)
{
  sunindextype i, N;
  realtype *xd, *yd;

  xd = yd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  yd = NV_DATA_S(y);

  if (a == ONE) {
    for (i = 0; i < N; i++)
      yd[i] += xd[i];
    return;
  }

  if (a == -ONE) {
    for (i = 0; i < N; i++)
      yd[i] -= xd[i];
    return;
  }

  for (i = 0; i < N; i++)
    yd[i] += a*xd[i];

  return;
}